

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

int next_arg_offset(rtosc_arg_val_t *cur)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  
  cVar1 = cur->type;
  if (cVar1 != 'a') {
    if (cVar1 == '-') {
      iVar3 = next_arg_offset(cur + 1);
      iVar2 = rtosc_av_rep_has_delta(cur);
      return iVar2 + iVar3 + 1;
    }
    if (cVar1 != ' ') {
      return 1;
    }
  }
  iVar2 = rtosc_av_arr_len(cur);
  return iVar2 + 1;
}

Assistant:

static int next_arg_offset(const rtosc_arg_val_t* cur)
{
    return (cur->type == 'a' || cur->type == ' ')
           ? rtosc_av_arr_len(cur) + 1
           : (cur->type == '-')
               ? 1                                    /* range arg */
                 + next_arg_offset(cur + 1)           /* start arg */
                 + (int) rtosc_av_rep_has_delta(cur)  /* delta arg */
               : 1;
}